

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

UObject * __thiscall icu_63::CalendarService::cloneInstance(CalendarService *this,UObject *instance)

{
  int iVar1;
  long *plVar2;
  UObject *pUVar3;
  undefined4 extraout_var;
  
  if (instance != (UObject *)0x0) {
    plVar2 = (long *)__dynamic_cast(instance,&UObject::typeinfo,&UnicodeString::typeinfo,0);
    if (plVar2 != (long *)0x0) {
      pUVar3 = (UObject *)(**(code **)(*plVar2 + 0x38))(plVar2);
      return pUVar3;
    }
  }
  iVar1 = (*instance->_vptr_UObject[3])(instance);
  return (UObject *)CONCAT44(extraout_var,iVar1);
}

Assistant:

virtual UObject* cloneInstance(UObject* instance) const {
        UnicodeString *s = dynamic_cast<UnicodeString *>(instance);
        if(s != NULL) {
            return s->clone();
        } else {
#ifdef U_DEBUG_CALSVC_F
            UErrorCode status2 = U_ZERO_ERROR;
            fprintf(stderr, "Cloning a %s calendar with tz=%ld\n", ((Calendar*)instance)->getType(), ((Calendar*)instance)->get(UCAL_ZONE_OFFSET, status2));
#endif
            return ((Calendar*)instance)->clone();
        }
    }